

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_set_failure_indexBeyondSize_bufferExpansionFailed_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 3;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 3;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x118138;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,4);
  builtin_strncpy(array.buffer,"012",4);
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  c = '3';
  uStack_60 = 0x118174;
  bVar1 = private_ACUtils_ADynArray_setRange(&array,3,1,&c,1);
  if (bVar1 != false) {
    local_78 = (char *)(ulong)bVar1;
    ppcVar4 = &local_78;
    local_70 = "false";
    pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar7 = 
    "private_ACUtils_ADynArray_setRange(&array, 3, 1, &(c), sizeof(*(&array)->buffer)) == false";
    pcVar3 = "private_ACUtils_ADynArray_setRange(&array, 3, 1, &(c), sizeof(*(&array)->buffer))";
    iVar2 = 0x69f;
    goto LAB_00118370;
  }
  uStack_60 = 0x11818d;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x69f);
  if (array.size == 3) {
    uStack_60 = 0x1181ad;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x6a0);
    if (array.capacity == 3) {
      uStack_60 = 0x1181cd;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x6a1);
      if (array.buffer == (char *)0x0) {
        ppcVar4 = &local_68;
        pcVar6 = "Assertion \'_ck_x != NULL\' failed";
        pcVar8 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) array.buffer != NULL";
        pcVar3 = "(void*) array.buffer";
        iVar2 = 0x6a2;
LAB_00118370:
        uStack_60 = 0;
        local_68 = (char *)0x0;
        *(undefined8 *)((long)ppcVar4 + -8) = 0x118377;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,iVar2,pcVar6,pcVar8,pcVar7,pcVar3);
      }
      uStack_60 = 0x1181ea;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x6a2);
      if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
        ppcVar4 = &local_68;
        pcVar6 = "Assertion \'_ck_x != NULL\' failed";
        pcVar8 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) array.growStrategy != NULL";
        pcVar3 = "(void*) array.growStrategy";
        iVar2 = 0x6a3;
        goto LAB_00118370;
      }
      uStack_60 = 0x118207;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x6a3);
      pcStack_90 = array.buffer;
      if (array.buffer == (char *)0x0) {
        pcStack_90 = "(null)";
        pcVar8 = "";
      }
      else {
        uStack_60 = 0x118224;
        iVar2 = strcmp("012",array.buffer);
        if (iVar2 == 0) {
          uStack_60 = 0x11823d;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6a4);
          uStack_60 = 0x118246;
          (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
          return;
        }
        pcVar8 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar6 = "array.buffer == \"012\"";
      pcVar7 = "array.buffer";
      iVar2 = 0x6a4;
      local_68 = "\"";
      local_70 = "012";
      local_78 = "\"";
      pcStack_80 = "\"012\"";
      ppcVar5 = &pcStack_90;
      pcStack_88 = pcVar8;
      goto LAB_001183da;
    }
    pcVar6 = "array.capacity == 3";
    pcVar7 = "array.capacity";
    iVar2 = 0x6a1;
    pcVar8 = (char *)array.capacity;
  }
  else {
    pcVar6 = "array.size == 3";
    pcVar7 = "array.size";
    iVar2 = 0x6a0;
    pcVar8 = (char *)array.size;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  local_68 = (char *)0x3;
  ppcVar5 = &local_70;
  local_70 = "3";
LAB_001183da:
  uStack_60 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) = test_ADynArray_set_failure_nullptr_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_set_failure_indexBeyondSize_bufferExpansionFailed)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 3;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 3;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity + 1);
    memcpy(array.buffer, "012", 4);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    char c = '3';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_set(&array, 3, c), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 3);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "012");
    array.deallocator(array.buffer);
}